

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

void __thiscall duckdb::ColumnData::ClearUpdates(ColumnData *this)

{
  _Head_base<0UL,_duckdb::UpdateSegment_*,_false> this_00;
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->update_lock);
  if (iVar1 == 0) {
    this_00._M_head_impl =
         (this->updates).
         super_unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>._M_t.
         super___uniq_ptr_impl<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::UpdateSegment_*,_std::default_delete<duckdb::UpdateSegment>_>
         .super__Head_base<0UL,_duckdb::UpdateSegment_*,_false>._M_head_impl;
    (this->updates).
    super_unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>._M_t.
    super___uniq_ptr_impl<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::UpdateSegment_*,_std::default_delete<duckdb::UpdateSegment>_>.
    super__Head_base<0UL,_duckdb::UpdateSegment_*,_false>._M_head_impl = (UpdateSegment *)0x0;
    if (this_00._M_head_impl != (UpdateSegment *)0x0) {
      UpdateSegment::~UpdateSegment(this_00._M_head_impl);
      operator_delete(this_00._M_head_impl);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->update_lock);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void ColumnData::ClearUpdates() {
	lock_guard<mutex> update_guard(update_lock);
	updates.reset();
}